

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlHashedString xmlParseQNameHashed(xmlParserCtxtPtr ctxt,xmlHashedString *prefix)

{
  xmlParserInputPtr pxVar1;
  xmlChar *pxVar2;
  bool bVar3;
  uint uVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  xmlChar *str1;
  xmlChar *pxVar7;
  xmlHashedString xVar8;
  ulong local_38;
  
  pxVar1 = ctxt->input;
  if (((pxVar1->flags & 0x40) == 0) && ((long)pxVar1->end - (long)pxVar1->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  pxVar7 = ctxt->input->cur;
  pxVar2 = ctxt->input->base;
  xVar8 = xmlParseNCName(ctxt);
  pxVar6 = xVar8.name;
  uVar4 = xVar8.hashValue;
  if (pxVar6 == (xmlChar *)0x0) {
    pxVar5 = (xmlChar *)0x0;
    str1 = (xmlChar *)0x0;
  }
  else if (*ctxt->input->cur == ':') {
    xmlNextChar(ctxt);
    local_38 = (ulong)uVar4;
    xVar8 = xmlParseNCName(ctxt);
    uVar4 = xVar8.hashValue;
    pxVar5 = pxVar6;
    str1 = xVar8.name;
  }
  else {
    pxVar5 = (xmlChar *)0x0;
    str1 = pxVar6;
  }
  if ((str1 == (xmlChar *)0x0) || (*ctxt->input->cur == ':')) {
    if ((pxVar6 == (xmlChar *)0x0) && (*ctxt->input->cur != ':')) {
LAB_00143a1a:
      bVar3 = false;
      str1 = (xmlChar *)0x0;
    }
    else {
      pxVar6 = xmlParseNmtoken(ctxt);
      if (pxVar6 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar6);
      }
      pxVar7 = ctxt->input->base + ((int)pxVar7 - (int)pxVar2);
      xVar8 = xmlDictLookupHashed(ctxt->dict,pxVar7,*(int *)&ctxt->input->cur - (int)pxVar7);
      str1 = xVar8.name;
      uVar4 = xVar8.hashValue;
      if (str1 == (xmlChar *)0x0) {
        xmlCtxtErrMemory(ctxt);
        goto LAB_00143a1a;
      }
      ctxt->nsWellFormed = 0;
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_NAMESPACE,XML_NS_ERR_QNAME,XML_ERR_ERROR,str1,
                 (xmlChar *)0x0,(xmlChar *)0x0,0,"Failed to parse QName \'%s\'\n",str1,0,0);
      bVar3 = true;
    }
    if (!bVar3) goto LAB_00143a31;
    pxVar5 = (xmlChar *)0x0;
  }
  *(ulong *)prefix = local_38;
  prefix->name = pxVar5;
LAB_00143a31:
  xVar8._4_4_ = 0;
  xVar8.hashValue = uVar4;
  xVar8.name = str1;
  return xVar8;
}

Assistant:

static xmlHashedString
xmlParseQNameHashed(xmlParserCtxtPtr ctxt, xmlHashedString *prefix) {
    xmlHashedString l, p;
    int start, isNCName = 0;

    l.name = NULL;
    p.name = NULL;

    GROW;
    start = CUR_PTR - BASE_PTR;

    l = xmlParseNCName(ctxt);
    if (l.name != NULL) {
        isNCName = 1;
        if (CUR == ':') {
            NEXT;
            p = l;
            l = xmlParseNCName(ctxt);
        }
    }
    if ((l.name == NULL) || (CUR == ':')) {
        xmlChar *tmp;

        l.name = NULL;
        p.name = NULL;
        if ((isNCName == 0) && (CUR != ':'))
            return(l);
        tmp = xmlParseNmtoken(ctxt);
        if (tmp != NULL)
            xmlFree(tmp);
        l = xmlDictLookupHashed(ctxt->dict, BASE_PTR + start,
                                CUR_PTR - (BASE_PTR + start));
        if (l.name == NULL) {
            xmlErrMemory(ctxt);
            return(l);
        }
        xmlNsErr(ctxt, XML_NS_ERR_QNAME,
                 "Failed to parse QName '%s'\n", l.name, NULL, NULL);
    }

    *prefix = p;
    return(l);
}